

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

bool __thiscall phyr::Sphere::intersectRay(Sphere *this,Ray *ray,bool testAlpha)

{
  double dVar1;
  double dVar2;
  FPError a;
  FPError b_00;
  FPError c;
  bool bVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  FPError *pFVar7;
  double dVar8;
  double dVar9;
  FPError t2;
  FPError t1;
  FPError b;
  Ray lr;
  FPError dz;
  FPError oz;
  FPError oy;
  FPError ox;
  FPError dy;
  FPError dx;
  Vector3f rdErr;
  Vector3f roErr;
  FPError local_250;
  double local_238;
  undefined8 uStack_230;
  FPError local_228;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  FPError local_1e0;
  FPError local_1c8;
  FPError local_1b0;
  double local_198;
  long lStack_190;
  double local_188;
  double local_180;
  long lStack_178;
  double local_170;
  FPError local_168;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  undefined8 uStack_110;
  FPError local_108;
  FPError local_f0;
  FPError local_d8;
  FPError local_c0;
  FPError local_a8;
  FPError local_90;
  Vector3f local_78;
  Vector3f local_58;
  FPError local_40;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 0.0;
  local_78.z = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  Transform::operator()((this->super_Shape).worldToLocal,ray,&local_58,&local_78);
  FPError::FPError(&local_c0,local_150,local_58.x);
  FPError::FPError(&local_d8,local_148,local_58.y);
  FPError::FPError(&local_f0,local_140,local_58.z);
  FPError::FPError(&local_90,local_138,local_78.x);
  FPError::FPError(&local_a8,local_130,local_78.y);
  FPError::FPError(&local_108,local_128,local_78.z);
  FPError::operator*(&local_228,&local_90,&local_90);
  FPError::operator*(&local_1b0,&local_a8,&local_a8);
  dVar2 = local_1b0.v;
  dVar1 = local_228.v;
  local_228.lBound = local_228.lBound + local_1b0.lBound;
  dVar4 = -INFINITY;
  if (-INFINITY < local_228.lBound) {
    dVar4 = (double)(~-(ulong)(local_228.lBound == 0.0) & (ulong)local_228.lBound |
                    -(ulong)(local_228.lBound == 0.0) & 0x8000000000000000);
    dVar4 = (double)((long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1);
  }
  local_228.uBound = local_228.uBound + local_1b0.uBound;
  local_1f8 = INFINITY;
  if (local_228.uBound < INFINITY) {
    local_228.uBound = (double)(~-(ulong)(local_228.uBound == 0.0) & (ulong)local_228.uBound);
    local_1f8 = (double)((-(ulong)(local_228.uBound < 0.0) | 1) + (long)local_228.uBound);
  }
  uStack_1f0 = 0;
  FPError::operator*(&local_250,&local_108,&local_108);
  dVar4 = dVar4 + local_250.lBound;
  if (-INFINITY < dVar4) {
    dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4 |
                    -(ulong)(dVar4 == 0.0) & 0x8000000000000000);
    lVar6 = (long)dVar4 + (ulong)(dVar4 <= 0.0) * 2 + -1;
  }
  else {
    lVar6 = -0x10000000000000;
  }
  local_1f8 = local_1f8 + local_250.uBound;
  if (local_1f8 < INFINITY) {
    local_1f8 = (double)(~-(ulong)(local_1f8 == 0.0) & (ulong)local_1f8);
    dVar4 = (double)((-(ulong)(local_1f8 < 0.0) | 1) + (long)local_1f8);
  }
  else {
    dVar4 = INFINITY;
  }
  local_1f8 = local_250.v;
  FPError::operator*(&local_1c8,&local_c0,&local_90);
  FPError::operator*(&local_1e0,&local_d8,&local_a8);
  dVar9 = local_1e0.v;
  dVar8 = local_1c8.lBound + local_1e0.lBound;
  dVar5 = -INFINITY;
  if (-INFINITY < dVar8) {
    dVar5 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 |
                    -(ulong)(dVar8 == 0.0) & 0x8000000000000000);
    dVar5 = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  dVar8 = local_1c8.uBound + local_1e0.uBound;
  local_208 = INFINITY;
  if (dVar8 < INFINITY) {
    dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
    local_208 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
  }
  uStack_200 = 0;
  local_238 = local_1c8.v;
  FPError::operator*(&local_168,&local_f0,&local_108);
  dVar5 = dVar5 + local_168.lBound;
  if (-INFINITY < dVar5) {
    dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                    -(ulong)(dVar5 == 0.0) & 0x8000000000000000);
    local_250.lBound = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  else {
    local_250.lBound = -INFINITY;
  }
  local_168.uBound = local_208 + local_168.uBound;
  if (local_168.uBound < INFINITY) {
    local_168.uBound = (double)(~-(ulong)(local_168.uBound == 0.0) & (ulong)local_168.uBound);
    local_250.uBound = (double)((-(ulong)(local_168.uBound < 0.0) | 1) + (long)local_168.uBound);
  }
  else {
    local_250.uBound = INFINITY;
  }
  local_250.v = local_238 + dVar9 + local_168.v;
  local_228.uBound = 2.0;
  local_228.v = 2.0;
  local_228.lBound = 2.0;
  FPError::operator*(&local_1b0,&local_228,&local_250);
  FPError::operator*(&local_228,&local_c0,&local_c0);
  FPError::operator*(&local_250,&local_d8,&local_d8);
  dVar5 = local_228.v;
  dVar9 = local_250.v;
  dVar8 = local_228.lBound + local_250.lBound;
  local_238 = -INFINITY;
  if (-INFINITY < dVar8) {
    dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 |
                    -(ulong)(dVar8 == 0.0) & 0x8000000000000000);
    local_238 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  uStack_230 = 0;
  dVar8 = local_228.uBound + local_250.uBound;
  local_118 = INFINITY;
  if (dVar8 < INFINITY) {
    dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
    local_118 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
  }
  uStack_110 = 0;
  FPError::operator*(&local_1c8,&local_f0,&local_f0);
  local_238 = local_238 + local_1c8.lBound;
  local_208 = -INFINITY;
  if (-INFINITY < local_238) {
    dVar8 = (double)(~-(ulong)(local_238 == 0.0) & (ulong)local_238 |
                    -(ulong)(local_238 == 0.0) & 0x8000000000000000);
    local_208 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  uStack_200 = 0;
  local_1c8.uBound = local_118 + local_1c8.uBound;
  local_238 = INFINITY;
  if (local_1c8.uBound < INFINITY) {
    local_1c8.uBound = (double)(~-(ulong)(local_1c8.uBound == 0.0) & (ulong)local_1c8.uBound);
    local_238 = (double)((-(ulong)(local_1c8.uBound < 0.0) | 1) + (long)local_1c8.uBound);
  }
  uStack_230 = 0;
  local_168.v = this->radius;
  local_168.lBound = local_168.v;
  local_168.uBound = local_168.v;
  local_40.v = local_168.v;
  local_40.lBound = local_168.v;
  local_40.uBound = local_168.v;
  FPError::operator*(&local_1e0,&local_168,&local_40);
  local_1e0.lBound = local_208 - local_1e0.lBound;
  if (-INFINITY < local_1e0.lBound) {
    dVar8 = (double)(~-(ulong)(local_1e0.lBound == 0.0) & (ulong)local_1e0.lBound |
                    -(ulong)(local_1e0.lBound == 0.0) & 0x8000000000000000);
    lStack_190 = (long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1;
  }
  else {
    lStack_190 = -0x10000000000000;
  }
  local_180 = dVar1 + dVar2 + local_1f8;
  local_1e0.uBound = local_238 - local_1e0.uBound;
  if (local_1e0.uBound < INFINITY) {
    local_1e0.uBound = (double)(~-(ulong)(local_1e0.uBound == 0.0) & (ulong)local_1e0.uBound);
    local_188 = (double)((-(ulong)(local_1e0.uBound < 0.0) | 1) + (long)local_1e0.uBound);
  }
  else {
    local_188 = INFINITY;
  }
  local_198 = (dVar5 + dVar9 + local_1c8.v) - local_1e0.v;
  a.lBound = (double)lVar6;
  a.v = local_180;
  a.uBound = dVar4;
  b_00.lBound = local_1b0.lBound;
  b_00.v = local_1b0.v;
  b_00.uBound = local_1b0.uBound;
  c.lBound = (double)lStack_190;
  c.v = local_198;
  c.uBound = local_188;
  lStack_178 = lVar6;
  local_170 = dVar4;
  bVar3 = solveQuadraticSystem(a,b_00,c,&local_228,&local_250);
  if (bVar3) {
    if (local_120 < local_228.uBound) {
      return false;
    }
    if (local_250.lBound <= 0.0) {
      return false;
    }
    pFVar7 = &local_228;
    if ((0.0 < local_228.lBound) ||
       (pFVar7 = &local_250, local_228.uBound = local_250.uBound, local_250.uBound <= local_120)) {
      dVar1 = pFVar7->v;
      dVar9 = dVar1 * local_138 + local_150;
      dVar5 = dVar1 * local_130 + local_148;
      dVar8 = dVar1 * local_128 + local_140;
      dVar2 = this->radius;
      dVar4 = this->zMin;
      dVar8 = (dVar2 / SQRT(dVar8 * dVar8 + dVar9 * dVar9 + dVar5 * dVar5)) * dVar8;
      if (((-dVar2 < dVar4) && (dVar8 < dVar4)) || ((this->zMax < dVar2 && (this->zMax < dVar8)))) {
        if (local_120 < local_228.uBound) {
          return false;
        }
        if ((dVar1 == local_250.v) && (!NAN(dVar1) && !NAN(local_250.v))) {
          return false;
        }
        local_150 = local_150 + local_138 * local_250.v;
        local_148 = local_148 + local_130 * local_250.v;
        local_140 = local_140 + local_128 * local_250.v;
        local_140 = (dVar2 / SQRT(local_140 * local_140 +
                                  local_150 * local_150 + local_148 * local_148)) * local_140;
        if ((-dVar2 < dVar4) && (local_140 < dVar4)) {
          return false;
        }
        if ((this->zMax < dVar2) && (this->zMax < local_140)) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError t0 = t1;
    if (t0.lowerBound() <= 0) {
        t0 = t2; if (t0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(t0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (t0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (t0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        t0 = t2; hpt = lr(Real(t0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    return true;
}